

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::AddSymbol
          (DescriptorBuilder *this,string *full_name,void *parent,string *name,Message *proto,
          Symbol symbol)

{
  _Node **pp_Var1;
  char *__s1;
  bool bVar2;
  int iVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  _Node *p_Var6;
  FileDescriptor *pFVar7;
  long *plVar8;
  long lVar9;
  undefined8 *puVar10;
  char cVar11;
  Symbol *pSVar12;
  ulong *puVar13;
  size_type *psVar14;
  char *pcVar15;
  ulong uVar16;
  uint in_R9D;
  _Node *p_Var17;
  Symbol symbol_00;
  Symbol symbol_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  Message *local_d0;
  undefined1 local_c8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  size_type local_40 [2];
  
  pFVar7 = this->file_;
  symbol_00._4_4_ = 0;
  symbol_00.type = in_R9D;
  symbol_00.field_1 = (anon_union_8_7_bfa3a334_for_Symbol_2)symbol._0_8_;
  local_d0 = proto;
  bVar2 = DescriptorPool::Tables::AddSymbol(this->tables_,full_name,symbol_00);
  if (bVar2) {
    if (parent != (void *)0x0) {
      pFVar7 = (FileDescriptor *)parent;
    }
    symbol_01._4_4_ = 0;
    symbol_01.type = in_R9D;
    symbol_01.field_1 = (anon_union_8_7_bfa3a334_for_Symbol_2)symbol._0_8_;
    bVar2 = FileDescriptorTables::AddAliasUnderParent
                      (this->file_tables_,pFVar7,(string *)(name->_M_dataplus)._M_p,symbol_01);
    if (!bVar2) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                 ,0xb30);
      pLVar4 = internal::LogMessage::operator<<((LogMessage *)local_c8,"\"");
      pLVar4 = internal::LogMessage::operator<<(pLVar4,full_name);
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,
                          "\" not previously defined in symbols_by_name_, but was defined in symbols_by_parent_; this shouldn\'t be possible."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar4);
      internal::LogMessage::~LogMessage((LogMessage *)local_c8);
      return false;
    }
    return true;
  }
  pp_Var1 = (this->tables_->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_buckets;
  uVar16 = (this->tables_->symbols_by_name_).
           super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
           .
           super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
           .
           super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
           ._M_bucket_count;
  __s1 = (full_name->_M_dataplus)._M_p;
  cVar11 = *__s1;
  if (cVar11 == '\0') {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    pcVar15 = __s1;
    do {
      pcVar15 = pcVar15 + 1;
      uVar5 = (long)cVar11 + uVar5 * 5;
      cVar11 = *pcVar15;
    } while (cVar11 != '\0');
  }
  for (p_Var17 = pp_Var1[uVar5 % uVar16]; p_Var17 != (_Node *)0x0; p_Var17 = p_Var17->_M_next) {
    iVar3 = strcmp(__s1,(p_Var17->_M_v).first);
    if (iVar3 == 0) {
      p_Var6 = pp_Var1[uVar16];
      goto LAB_001d4b41;
    }
  }
  p_Var6 = pp_Var1[uVar16];
  p_Var17 = p_Var6;
LAB_001d4b41:
  pSVar12 = &(p_Var17->_M_v).second;
  if (p_Var17 == p_Var6) {
    pSVar12 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
  }
  pFVar7 = anon_unknown_1::Symbol::GetFile((Symbol *)(ulong)pSVar12->type);
  if (pFVar7 != this->file_) {
    std::operator+(&local_90,"\"",full_name);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    puVar13 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar13) {
      local_e0 = *puVar13;
      lStack_d8 = plVar8[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar13;
      local_f0 = (ulong *)*plVar8;
    }
    local_e8 = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,**(ulong **)pFVar7);
    psVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_110.field_2._M_allocated_capacity = *psVar14;
      local_110.field_2._8_8_ = puVar10[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar14;
      local_110._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_110._M_string_length = puVar10[1];
    *puVar10 = psVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar14) {
      local_c8._16_8_ = *psVar14;
      local_c8._24_8_ = plVar8[3];
      local_c8._0_8_ = local_c8 + 0x10;
    }
    else {
      local_c8._16_8_ = *psVar14;
      local_c8._0_8_ = (size_type *)*plVar8;
    }
    local_c8._8_8_ = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    AddError(this,full_name,local_d0,NAME,(string *)local_c8);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    local_40[0] = local_90.field_2._M_allocated_capacity;
    local_50[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return false;
    }
    goto LAB_001d50ad;
  }
  lVar9 = std::__cxx11::string::rfind((char)full_name,0x2e);
  if (lVar9 == -1) {
    std::operator+(&local_110,"\"",full_name);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar14) {
      local_c8._16_8_ = *psVar14;
      local_c8._24_8_ = plVar8[3];
      local_c8._0_8_ = local_c8 + 0x10;
    }
    else {
      local_c8._16_8_ = *psVar14;
      local_c8._0_8_ = (size_type *)*plVar8;
    }
    local_c8._8_8_ = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    AddError(this,full_name,local_d0,NAME,(string *)local_c8);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    local_40[0] = local_110.field_2._M_allocated_capacity;
    local_50[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) {
      return false;
    }
    goto LAB_001d50ad;
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)full_name);
  puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x23cacb);
  psVar14 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_90.field_2._M_allocated_capacity = *psVar14;
    local_90.field_2._8_8_ = puVar10[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar14;
    local_90._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_90._M_string_length = puVar10[1];
  *puVar10 = psVar14;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_e0 = *puVar13;
    lStack_d8 = plVar8[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar13;
    local_f0 = (ulong *)*plVar8;
  }
  local_e8 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_70,(ulong)full_name);
  uVar16 = 0xf;
  if (local_f0 != &local_e0) {
    uVar16 = local_e0;
  }
  if (uVar16 < (ulong)(local_68 + local_e8)) {
    uVar16 = 0xf;
    if (local_70 != local_60) {
      uVar16 = local_60[0];
    }
    if (uVar16 < (ulong)(local_68 + local_e8)) goto LAB_001d4ed9;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_001d4ed9:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_70);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  psVar14 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_110.field_2._M_allocated_capacity = *psVar14;
    local_110.field_2._8_8_ = puVar10[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar14;
    local_110._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_110._M_string_length = puVar10[1];
  *puVar10 = psVar14;
  puVar10[1] = 0;
  *(undefined1 *)psVar14 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
  psVar14 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar14) {
    local_c8._16_8_ = *psVar14;
    local_c8._24_8_ = plVar8[3];
    local_c8._0_8_ = local_c8 + 0x10;
  }
  else {
    local_c8._16_8_ = *psVar14;
    local_c8._0_8_ = (size_type *)*plVar8;
  }
  local_c8._8_8_ = plVar8[1];
  *plVar8 = (long)psVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AddError(this,full_name,local_d0,NAME,(string *)local_c8);
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40) {
    return false;
  }
LAB_001d50ad:
  operator_delete(local_50[0],local_40[0] + 1);
  return false;
}

Assistant:

bool DescriptorBuilder::AddSymbol(
    const string& full_name, const void* parent, const string& name,
    const Message& proto, Symbol symbol) {
  // If the caller passed NULL for the parent, the symbol is at file scope.
  // Use its file as the parent instead.
  if (parent == NULL) parent = file_;

  if (tables_->AddSymbol(full_name, symbol)) {
    if (!file_tables_->AddAliasUnderParent(parent, name, symbol)) {
      GOOGLE_LOG(DFATAL) << "\"" << full_name << "\" not previously defined in "
                     "symbols_by_name_, but was defined in symbols_by_parent_; "
                     "this shouldn't be possible.";
      return false;
    }
    return true;
  } else {
    const FileDescriptor* other_file = tables_->FindSymbol(full_name).GetFile();
    if (other_file == file_) {
      string::size_type dot_pos = full_name.find_last_of('.');
      if (dot_pos == string::npos) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name + "\" is already defined.");
      } else {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name.substr(dot_pos + 1) +
                 "\" is already defined in \"" +
                 full_name.substr(0, dot_pos) + "\".");
      }
    } else {
      // Symbol seems to have been defined in a different file.
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + full_name + "\" is already defined in file \"" +
               other_file->name() + "\".");
    }
    return false;
  }
}